

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_00;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *other;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar5;
  SimpleDictionaryPropertyDescriptor<int> *pSVar6;
  int iStack_28;
  SimpleDictionaryPropertyDescriptor<int> descriptor;
  int i;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *newTypeHandler;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x23b,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>,Js::JavascriptString*>
                      (this,instance);
  if (((byte)this[0x28] >> 1 & 1) == 0) {
    descriptor._0_1_ = 0;
    descriptor.Attributes = '\0';
    descriptor._2_2_ = 0;
    while( true ) {
      pBVar5 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      iVar3 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::Count(pBVar5);
      if (iVar3 <= (int)descriptor._0_4_) break;
      pBVar5 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      pSVar6 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar5,descriptor._0_4_);
      if (((ulong)*pSVar6 & 0x800) != 0) {
        iStack_28 = (*pSVar6).propertyIndex;
        SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
        TryRegisterDeletedPropertyIndex(this_00,instance,iStack_28);
      }
      descriptor._0_4_ = descriptor._0_4_ + 1;
    }
  }
  else {
    other = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::AsUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this);
    SimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>::
    CopyUnorderedStateFrom<int,Js::JavascriptString*,false>
              ((SimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false> *)this_00,
               other,instance);
  }
  return this_00;
}

Assistant:

SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToSimpleDictionaryUnorderedTypeHandler(DynamicObject* instance)
    {
        CompileAssert(sizeof(NewTPropertyIndex) >= sizeof(TPropertyIndex));
        Assert(instance);

        SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported> *const newTypeHandler =
            ConvertToTypeHandler<SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>, NewTMapKey>(instance);

        if(isUnordered)
        {
            newTypeHandler->CopyUnorderedStateFrom(*AsUnordered(), instance);
        }
        else
        {
            for(int i = 0; i < propertyMap->Count(); ++i)
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(i));
                if(descriptor.Attributes & PropertyDeleted)
                {
                    newTypeHandler->TryRegisterDeletedPropertyIndex(instance, descriptor.propertyIndex);
                }
            }
        }

        return newTypeHandler;
    }